

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.h
# Opt level: O1

bool __thiscall
CDBIterator::GetKey<(anonymous_namespace)::DBHeightKey>(CDBIterator *this,DBHeightKey *key)

{
  char *pcVar1;
  size_t in_RCX;
  long in_FS_OFFSET;
  Span<const_std::byte> sp;
  DataStream ssKey;
  uint8_t obj;
  DataStream DStack_58;
  uint local_38 [2];
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  sp = GetKeyImpl(this);
  DataStream::DataStream(&DStack_58,sp);
  DataStream::read(&DStack_58,(int)local_38,(void *)0x1,in_RCX);
  if ((char)local_38[0] == 't') {
    DataStream::read(&DStack_58,(int)local_38,(void *)0x4,in_RCX);
    key->height = local_38[0] >> 0x18 | (local_38[0] & 0xff0000) >> 8 | (local_38[0] & 0xff00) << 8
                  | local_38[0] << 0x18;
    std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
              ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&DStack_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return true;
    }
  }
  else {
    pcVar1 = (char *)__cxa_allocate_exception(0x20);
    local_30 = std::iostream_category();
    local_38[0] = 1;
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar1,(error_code *)"Invalid format for block filter index DB height key");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(pcVar1,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

bool GetKey(K& key) {
        try {
            DataStream ssKey{GetKeyImpl()};
            ssKey >> key;
        } catch (const std::exception&) {
            return false;
        }
        return true;
    }